

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestReporter.cpp
# Opt level: O2

bool __thiscall
ApprovalTests::DocTestReporter::report(DocTestReporter *this,string *received,string *approved)

{
  code *pcVar1;
  char extraout_AL;
  undefined1 uVar2;
  double __x;
  ExpressionDecomposer local_114;
  Result local_110;
  string approvedText;
  string receivedText;
  string *local_b0;
  Enum local_a8;
  ResultBuilder DOCTEST_RB;
  
  FileUtils::readFileThrowIfMissing(&receivedText,received);
  FileUtils::readFileThrowIfMissing(&approvedText,approved);
  doctest::String::String((String *)&local_110,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/examples/out_of_source/DocTestReporter.cpp"
             ,0xc,"receivedText == approvedText","",(String *)&local_110);
  doctest::String::~String((String *)&local_110);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_114,DT_CHECK);
  local_a8 = local_114.m_at;
  local_b0 = &receivedText;
  doctest::detail::Expression_lhs<std::__cxx11::string&>::operator==
            (&local_110,(Expression_lhs<std::__cxx11::string&> *)&local_b0,&approvedText);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_110);
  doctest::String::~String(&local_110.m_decomp);
  doctest::detail::ResultBuilder::log(&DOCTEST_RB,__x);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    uVar2 = (*pcVar1)();
    return (bool)uVar2;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  ::std::__cxx11::string::~string((string *)&approvedText);
  ::std::__cxx11::string::~string((string *)&receivedText);
  return true;
}

Assistant:

bool DocTestReporter::report(std::string received, std::string approved) const
    {
        auto receivedText = FileUtils::readFileThrowIfMissing(received);
        auto approvedText = FileUtils::readFileThrowIfMissing(approved);
        CHECK(receivedText == approvedText);
        return true;
    }